

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_threads.c
# Opt level: O3

void thread_bridge_transfer
               (CManager source_cm,event_item *event,CManager target_cm,EVstone target_stone)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  event_item *event_00;
  undefined8 uVar3;
  FMFormat p_Var4;
  pthread_t pVar5;
  long lVar6;
  event_item *peVar7;
  CManager cm;
  event_item *peVar8;
  byte bVar9;
  timespec ts;
  timespec local_40;
  
  bVar9 = 0;
  if (target_cm == source_cm) {
    internal_path_submit(source_cm,target_stone,event);
    return;
  }
  if (source_cm < target_cm) {
    iVar1 = CManager_locked(source_cm);
    if (iVar1 == 0) {
      __assert_fail("CManager_locked(source_cm)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
                    ,0x2f,"void thread_bridge_transfer(CManager, event_item *, CManager, EVstone)");
    }
    iVar1 = 0x30;
    cm = target_cm;
  }
  else {
    IntCManager_unlock(source_cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
                       ,0x38);
    IntCManager_lock(target_cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
                     ,0x39);
    iVar1 = 0x3a;
    cm = source_cm;
  }
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
                   ,iVar1);
  event_00 = get_free_event(target_cm->evp);
  peVar7 = event;
  peVar8 = event_00;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    iVar1 = peVar7->event_encoded;
    peVar8->ref_count = peVar7->ref_count;
    peVar8->event_encoded = iVar1;
    peVar7 = (event_item *)((long)peVar7 + (ulong)bVar9 * -0x10 + 8);
    peVar8 = (event_item *)((long)peVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  CMint_add_ref_attr_list
            (source_cm,event_00->attrs,
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
             ,0x55);
  event_00->format = (CMFormat)0x0;
  event_00->ref_count = 1;
  event_00->free_arg = event;
  event_00->free_func = free_master_event;
  event_00->contents = Event_Freeable;
  event_00->cm = target_cm;
  uVar3 = get_server_ID_FMformat(event->reference_format,&local_40);
  p_Var4 = (FMFormat)FMformat_from_ID(target_cm->evp->fmc,uVar3);
  event_00->reference_format = p_Var4;
  if (1 < event->contents - Event_Freeable) {
    if (event->contents != Event_App_Owned) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
                    ,0x79,"event_item *clone_event(CManager, event_item *, CManager)");
    }
    ensure_ev_owned(source_cm,event_00);
  }
  internal_path_submit(target_cm,target_stone,event_00);
  return_event(source_cm->evp,event_00);
  iVar1 = CMtrace_val[10];
  if (source_cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(source_cm,EVerbose);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)source_cm->CMTrace_file;
      _Var2 = getpid();
      pVar5 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)source_cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)source_cm->CMTrace_file,
            "Transferring event %p from cm %p to cm %p, new_event %p\n\n",source_cm,target_cm,event,
            event_00);
  }
  fflush((FILE *)source_cm->CMTrace_file);
  IntCManager_unlock(target_cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
                     ,0x42);
  CMwake_server_thread(target_cm);
  return;
}

Assistant:

extern void 
thread_bridge_transfer(CManager source_cm, event_item *event, 
		       CManager target_cm, EVstone target_stone)
{
    event_item *new_event;
    if (target_cm == source_cm) {
	internal_path_submit(source_cm, target_stone, event);
	return;
    } else if (target_cm > source_cm) {
	/* source_cm should already be locked, lock the destination */
	assert(CManager_locked(source_cm));
	CManager_lock(target_cm);
    } else {
	/* 
	 * we want to lock the CM's in smallest-first order.
	 * source_cm is larger, so unlock that and then re-aquire the locks.
	 * strict ordering avoids deadlock in case they are transferring 
	 * something to us.
	 */
	CManager_unlock(source_cm);
	CManager_lock(target_cm);
	CManager_lock(source_cm);
    }
    /* Both CMs are locked now */
    new_event = clone_event(source_cm, event, target_cm);
    internal_path_submit(target_cm, target_stone, new_event);
    return_event(source_cm->evp, new_event);
    CMtrace_out(source_cm, EVerbose, "Transferring event %p from cm %p to cm %p, new_event %p\n\n",
		source_cm, target_cm, event, new_event);
    CManager_unlock(target_cm);
    CMwake_server_thread(target_cm);
}